

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,HeapType type,
          vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
          *resumetable)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  Result<wasm::Ok> local_d8;
  optional<unsigned_int> local_ac;
  value_type local_a0;
  reference local_98;
  OnClauseInfo *info;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
  *__range2;
  undefined1 local_68 [8];
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> labels;
  vector<wasm::Name,_std::allocator<wasm::Name>_> tags;
  vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
  *resumetable_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  HeapType type_local;
  
  this_00 = &labels.
             super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_00);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             local_68);
  sVar2 = std::
          vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
          ::size(resumetable);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_00,sVar2);
  sVar2 = std::
          vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
          ::size(resumetable);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::reserve
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             local_68,sVar2);
  __end2 = std::
           vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
           ::begin(resumetable);
  info = (OnClauseInfo *)
         std::
         vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
         ::end(resumetable);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::WATParser::ParseDefsCtx::OnClauseInfo_*,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                                *)&info);
    if (!bVar1) break;
    local_98 = __gnu_cxx::
               __normal_iterator<const_wasm::WATParser::ParseDefsCtx::OnClauseInfo_*,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
               ::operator*(&__end2);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               &labels.
                super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_98->tag);
    if ((local_98->isOnSwitch & 1U) == 0) {
      std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>(&local_ac,&local_98->label);
      std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::
      push_back((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 *)local_68,&local_ac);
    }
    else {
      std::optional<unsigned_int>::optional();
      std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::
      push_back((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 *)local_68,&local_a0);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::WATParser::ParseDefsCtx::OnClauseInfo_*,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
    ::operator++(&__end2);
  }
  IRBuilder::makeResume
            (&local_d8,&this->irBuilder,type,
             (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
             &labels.
              super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             local_68);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_d8);
  Result<wasm::Ok>::~Result(&local_d8);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::~vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             local_68);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
             &labels.
              super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeResume(Index pos,
                      const std::vector<Annotation>& annotations,
                      HeapType type,
                      const std::vector<OnClauseInfo>& resumetable) {
    std::vector<Name> tags;
    std::vector<std::optional<Index>> labels;
    tags.reserve(resumetable.size());
    labels.reserve(resumetable.size());
    for (const OnClauseInfo& info : resumetable) {
      tags.push_back(info.tag);
      if (info.isOnSwitch) {
        labels.push_back(std::nullopt);
      } else {
        labels.push_back(std::optional<Index>(info.label));
      }
    }
    return withLoc(pos, irBuilder.makeResume(type, tags, labels));
  }